

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O0

void Abc_GenMesh(char *pFileName,int nVars)

{
  FILE *__stream;
  char *pcVar1;
  uint local_28;
  uint local_24;
  int k;
  int i;
  FILE *pFile;
  int nVars_local;
  char *pFileName_local;
  
  if (0 < nVars) {
    __stream = fopen(pFileName,"w");
    pcVar1 = Extra_TimeStamp();
    fprintf(__stream,"# %dx%d mesh generated by ABC on %s\n",(ulong)(uint)nVars,(ulong)(uint)nVars,
            pcVar1);
    fprintf(__stream,".model mesh%d\n",(ulong)(uint)nVars);
    for (local_24 = 0; (int)local_24 < nVars; local_24 = local_24 + 1) {
      for (local_28 = 0; (int)local_28 < nVars; local_28 = local_28 + 1) {
        fprintf(__stream,".inputs");
        fprintf(__stream," p%d%dx1",(ulong)local_24,(ulong)local_28);
        fprintf(__stream," p%d%dx2",(ulong)local_24,(ulong)local_28);
        fprintf(__stream," p%d%dy1",(ulong)local_24,(ulong)local_28);
        fprintf(__stream," p%d%dy2",(ulong)local_24,(ulong)local_28);
        fprintf(__stream,"\n");
      }
    }
    fprintf(__stream,".inputs");
    for (local_24 = 0; (int)local_24 < nVars; local_24 = local_24 + 1) {
      fprintf(__stream," v%02d v%02d",(ulong)(local_24 << 1),(ulong)(local_24 * 2 + 1));
    }
    fprintf(__stream,"\n");
    fprintf(__stream,".outputs");
    fprintf(__stream," fx00");
    fprintf(__stream,"\n");
    for (local_24 = 0; (int)local_24 < nVars; local_24 = local_24 + 1) {
      for (local_28 = 0; (int)local_28 < nVars; local_28 = local_28 + 1) {
        fprintf(__stream,".subckt cell");
        fprintf(__stream," px1=p%d%dx1",(ulong)local_24,(ulong)local_28);
        fprintf(__stream," px2=p%d%dx2",(ulong)local_24,(ulong)local_28);
        fprintf(__stream," py1=p%d%dy1",(ulong)local_24,(ulong)local_28);
        fprintf(__stream," py2=p%d%dy2",(ulong)local_24,(ulong)local_28);
        if (local_28 == nVars - 1U) {
          fprintf(__stream," x=v%02d",(ulong)local_24);
        }
        else {
          fprintf(__stream," x=fx%d%d",(ulong)local_24,(ulong)(local_28 + 1));
        }
        if (local_24 == nVars - 1U) {
          fprintf(__stream," y=v%02d",(ulong)(nVars + local_28));
        }
        else {
          fprintf(__stream," y=fy%d%d",(ulong)(local_24 + 1),(ulong)local_28);
        }
        fprintf(__stream," fx=fx%d%d",(ulong)local_24,(ulong)local_28);
        fprintf(__stream," fy=fy%d%d",(ulong)local_24,(ulong)local_28);
        fprintf(__stream,"\n");
      }
    }
    fprintf(__stream,".end\n");
    fprintf(__stream,"\n");
    fprintf(__stream,"\n");
    Abc_WriteCell((FILE *)__stream);
    fclose(__stream);
    return;
  }
  __assert_fail("nVars > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcGen.c"
                ,0x171,"void Abc_GenMesh(char *, int)");
}

Assistant:

void Abc_GenMesh( char * pFileName, int nVars )
{
    FILE * pFile;
    int i, k;

    assert( nVars > 0 );

    pFile = fopen( pFileName, "w" );
    fprintf( pFile, "# %dx%d mesh generated by ABC on %s\n", nVars, nVars, Extra_TimeStamp() );
    fprintf( pFile, ".model mesh%d\n", nVars );

    for ( i = 0; i < nVars; i++ )
        for ( k = 0; k < nVars; k++ )
        {
            fprintf( pFile, ".inputs" );
            fprintf( pFile, " p%d%dx1", i, k );
            fprintf( pFile, " p%d%dx2", i, k );
            fprintf( pFile, " p%d%dy1", i, k );
            fprintf( pFile, " p%d%dy2", i, k );
            fprintf( pFile, "\n" );
        }
    fprintf( pFile, ".inputs" );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " v%02d v%02d", 2*i, 2*i+1 );
    fprintf( pFile, "\n" );

    fprintf( pFile, ".outputs" );
    fprintf( pFile, " fx00" );
    fprintf( pFile, "\n" );

    for ( i = 0; i < nVars; i++ ) // horizontal
        for ( k = 0; k < nVars; k++ ) // vertical
        {
            fprintf( pFile, ".subckt cell" );
            fprintf( pFile, " px1=p%d%dx1", i, k );
            fprintf( pFile, " px2=p%d%dx2", i, k );
            fprintf( pFile, " py1=p%d%dy1", i, k );
            fprintf( pFile, " py2=p%d%dy2", i, k );
            if ( k == nVars - 1 )
                fprintf( pFile, " x=v%02d", i );
            else
                fprintf( pFile, " x=fx%d%d", i, k+1 );
            if ( i == nVars - 1 )
                fprintf( pFile, " y=v%02d", nVars+k );
            else
                fprintf( pFile, " y=fy%d%d", i+1, k );
            // outputs
            fprintf( pFile, " fx=fx%d%d", i, k );
            fprintf( pFile, " fy=fy%d%d", i, k );
            fprintf( pFile, "\n" );
        }
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    Abc_WriteCell( pFile );
    fclose( pFile );
}